

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O0

void __thiscall ExprWriter::visit(ExprWriter *this,CallExpr *expr)

{
  Expr *pEVar1;
  bool bVar2;
  reference ppEVar3;
  long in_RSI;
  ExprWriter *in_RDI;
  Expr *param;
  iterator __end1;
  iterator __begin1;
  vector<Expr_*,_std::allocator<Expr_*>_> *__range1;
  bool first;
  ret_type CAST;
  Expr *call;
  bool isVaFunc;
  Expr *in_stack_ffffffffffffff98;
  bool local_51;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> local_40;
  long local_38;
  byte local_29;
  ret_type local_28;
  Expr *local_20;
  bool local_11;
  long local_10;
  
  local_10 = in_RSI;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI,(char *)in_stack_ffffffffffffff98);
  local_51 = true;
  if (!bVar2) {
    local_51 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_RDI,(char *)in_stack_ffffffffffffff98);
  }
  local_11 = local_51;
  if (*(long *)(local_10 + 0x50) == 0) {
    std::operator<<(in_RDI->ss,(string *)(local_10 + 0x18));
  }
  else {
    local_20 = *(Expr **)(local_10 + 0x50);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
           *)&in_RDI->noFuncCasts)->_M_local_buf[0] & 1U) != 0) {
      while (local_28 = llvm::dyn_cast_or_null<CastExpr,Expr>((Expr *)in_RDI),
            local_28 != (ret_type)0x0) {
        local_20 = (local_28->super_UnaryExpr).expr;
      }
      local_28 = (ret_type)0x0;
    }
    parensIfNotSimple(in_RDI,in_stack_ffffffffffffff98);
  }
  std::operator<<(in_RDI->ss,"(");
  if ((local_11 & 1U) != 0) {
    std::operator<<(in_RDI->ss,"(void*)(");
  }
  local_29 = 1;
  local_38 = local_10 + 0x38;
  local_40._M_current =
       (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::begin
                          ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff98);
  std::vector<Expr_*,_std::allocator<Expr_*>_>::end
            ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff98);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                             *)in_stack_ffffffffffffff98), bVar2) {
    ppEVar3 = __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
              operator*(&local_40);
    pEVar1 = *ppEVar3;
    if ((local_29 & 1) == 0) {
      std::operator<<(in_RDI->ss,", ");
      (*pEVar1->_vptr_Expr[2])(pEVar1,in_RDI);
    }
    else {
      (*pEVar1->_vptr_Expr[2])(pEVar1,in_RDI);
      if ((local_11 & 1U) != 0) {
        std::operator<<(in_RDI->ss,")");
      }
    }
    local_29 = 0;
    __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::operator++
              (&local_40);
  }
  std::operator<<(in_RDI->ss,")");
  return;
}

Assistant:

void ExprWriter::visit(CallExpr& expr) {
    bool isVaFunc = (expr.funcName == "va_start" || expr.funcName == "va_end");

    if (expr.funcValue) {
        auto call = expr.funcValue;

        if (noFuncCasts) {
            // strip all the casts
            while (auto CAST = llvm::dyn_cast_or_null<CastExpr>(call)) {
                call = CAST->expr;
            }
        }

        parensIfNotSimple(call);
    } else {
        ss << expr.funcName;
    }

    ss << "(";
    if (isVaFunc) {
        ss << "(void*)(";
    }

    bool first = true;
    for (auto param : expr.params) {
        if (first) {
            param->accept(*this);
            if (isVaFunc) {
                ss << ")";
            }

        } else {
            ss << ", ";
            param->accept(*this);
        }

        first = false;
    }

    ss << ")";
}